

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathRSTimestepArrived
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,size_t Timestep,
               SstPreloadModeType PreloadMode)

{
  int in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  Evpath_RS_Stream RS_Stream;
  
  (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 8),4,
                     "EVPATH registering reader arrival of TS %ld metadata, preload mode %d\n",
                     in_RDX,in_ECX);
  if (in_ECX != *(int *)(in_RSI + 0x70)) {
    *(undefined8 *)(in_RSI + 0x78) = in_RDX;
    *(int *)(in_RSI + 0x70) = in_ECX;
  }
  return;
}

Assistant:

static void EvpathRSTimestepArrived(CP_Services Svcs, DP_RS_Stream RS_Stream_v, size_t Timestep,
                                    SstPreloadModeType PreloadMode)
{
    Evpath_RS_Stream RS_Stream = (Evpath_RS_Stream)RS_Stream_v;
    Svcs->verbose(RS_Stream->CP_Stream, DPPerRankVerbose,
                  "EVPATH registering reader arrival of TS %ld metadata, preload mode "
                  "%d\n",
                  Timestep, PreloadMode);
    if (PreloadMode != RS_Stream->CurPreloadMode)
    {
        RS_Stream->PreloadActiveTimestep = Timestep;
        RS_Stream->CurPreloadMode = PreloadMode;
    }
}